

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O0

void exit_cb(uv_process_t *process,int64_t exit_status,int term_signal)

{
  int term_signal_local;
  int64_t exit_status_local;
  uv_process_t *process_local;
  
  printf("exit_cb\n");
  exit_cb_called = exit_cb_called + 1;
  if (exit_status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0x37,"exit_status == 0");
    abort();
  }
  if (term_signal != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0x38,"term_signal == 0");
    abort();
  }
  uv_close((uv_handle_t *)process,close_cb);
  uv_close((uv_handle_t *)&in,close_cb);
  uv_close((uv_handle_t *)&out,close_cb);
  return;
}

Assistant:

static void exit_cb(uv_process_t* process,
                    int64_t exit_status,
                    int term_signal) {
  printf("exit_cb\n");
  exit_cb_called++;
  ASSERT(exit_status == 0);
  ASSERT(term_signal == 0);
  uv_close((uv_handle_t*)process, NULL);
}